

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_FormatError_Test::TestBody
          (BioparserSamTest_FormatError_Test *this)

{
  Parser<bioparser::test::SamOverlap> *pPVar1;
  allocator local_40 [16];
  AssertionResult gtest_ar;
  
  std::__cxx11::string::string((string *)&gtest_ar,"sample.paf",local_40);
  BioparserSamTest::Setup(&this->super_BioparserSamTest,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pPVar1 = (this->super_BioparserSamTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&gtest_ar,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::_M_move_assign(&(this->super_BioparserSamTest).o,&gtest_ar);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
             *)&gtest_ar);
  return;
}

Assistant:

TEST_F(BioparserSamTest, FormatError) {
  Setup("sample.paf");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::SamParser] error: invalid file format");
  }
}